

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

void __thiscall
SQLexer::Init(SQLexer *this,SQSharedState *ss,SQLEXREADFUNC rg,SQUserPointer up,
             CompilerErrorFunc efunc,void *ed)

{
  SQTable *pSVar1;
  SQString *pSVar2;
  SQObjectPtr local_508;
  SQObjectPtr local_4f8;
  SQObjectPtr local_4e8;
  SQObjectPtr local_4d8;
  SQObjectPtr local_4c8;
  SQObjectPtr local_4b8;
  SQObjectPtr local_4a8;
  SQObjectPtr local_498;
  SQObjectPtr local_488;
  SQObjectPtr local_478;
  SQObjectPtr local_468;
  SQObjectPtr local_458;
  SQObjectPtr local_448;
  SQObjectPtr local_438;
  SQObjectPtr local_428;
  SQObjectPtr local_418;
  SQObjectPtr local_408;
  SQObjectPtr local_3f8;
  SQObjectPtr local_3e8;
  SQObjectPtr local_3d8;
  SQObjectPtr local_3c8;
  SQObjectPtr local_3b8;
  SQObjectPtr local_3a8;
  SQObjectPtr local_398;
  SQObjectPtr local_388;
  SQObjectPtr local_378;
  SQObjectPtr local_368;
  SQObjectPtr local_358;
  SQObjectPtr local_348;
  SQObjectPtr local_338;
  SQObjectPtr local_328;
  SQObjectPtr local_318;
  SQObjectPtr local_308;
  SQObjectPtr local_2f8;
  SQObjectPtr local_2e8;
  SQObjectPtr local_2d8;
  SQObjectPtr local_2c8;
  SQObjectPtr local_2b8;
  SQObjectPtr local_2a8;
  SQObjectPtr local_298;
  SQObjectPtr local_288;
  SQObjectPtr local_278;
  SQObjectPtr local_268;
  SQObjectPtr local_258;
  SQObjectPtr local_248;
  SQObjectPtr local_238;
  SQObjectPtr local_228;
  SQObjectPtr local_218;
  SQObjectPtr local_208;
  SQObjectPtr local_1f8;
  SQObjectPtr local_1e8;
  SQObjectPtr local_1d8;
  SQObjectPtr local_1c8;
  SQObjectPtr local_1b8;
  SQObjectPtr local_1a8;
  SQObjectPtr local_198;
  SQObjectPtr local_188;
  SQObjectPtr local_178;
  SQObjectPtr local_168;
  SQObjectPtr local_158;
  SQObjectPtr local_148;
  SQObjectPtr local_138;
  SQObjectPtr local_128;
  SQObjectPtr local_118;
  SQObjectPtr local_108;
  SQObjectPtr local_f8;
  SQObjectPtr local_e8;
  SQObjectPtr local_d8;
  SQObjectPtr local_c8;
  SQObjectPtr local_b8;
  SQObjectPtr local_a8;
  SQObjectPtr local_98;
  SQObjectPtr local_88;
  SQObjectPtr local_78 [2];
  SQObjectPtr local_58;
  SQObjectPtr local_48;
  void *local_38;
  void *ed_local;
  CompilerErrorFunc efunc_local;
  SQUserPointer up_local;
  SQLEXREADFUNC rg_local;
  SQSharedState *ss_local;
  SQLexer *this_local;
  
  this->_errfunc = efunc;
  this->_errtarget = ed;
  this->_sharedstate = ss;
  local_38 = ed;
  ed_local = efunc;
  efunc_local = (CompilerErrorFunc)up;
  up_local = rg;
  rg_local = (SQLEXREADFUNC)ss;
  ss_local = (SQSharedState *)this;
  pSVar1 = SQTable::Create(ss,0x25);
  this->_keywords = pSVar1;
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"while",-1);
  ::SQObjectPtr::SQObjectPtr(&local_48,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_58,0x112);
  SQTable::NewSlot(pSVar1,&local_48,&local_58);
  ::SQObjectPtr::~SQObjectPtr(&local_58);
  ::SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"do",-1);
  ::SQObjectPtr::SQObjectPtr(local_78,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_88,0x115);
  SQTable::NewSlot(pSVar1,local_78,&local_88);
  ::SQObjectPtr::~SQObjectPtr(&local_88);
  ::SQObjectPtr::~SQObjectPtr(local_78);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"if",-1);
  ::SQObjectPtr::SQObjectPtr(&local_98,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_a8,0x110);
  SQTable::NewSlot(pSVar1,&local_98,&local_a8);
  ::SQObjectPtr::~SQObjectPtr(&local_a8);
  ::SQObjectPtr::~SQObjectPtr(&local_98);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"else",-1);
  ::SQObjectPtr::SQObjectPtr(&local_b8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_c8,0x111);
  SQTable::NewSlot(pSVar1,&local_b8,&local_c8);
  ::SQObjectPtr::~SQObjectPtr(&local_c8);
  ::SQObjectPtr::~SQObjectPtr(&local_b8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"break",-1);
  ::SQObjectPtr::SQObjectPtr(&local_d8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_e8,0x113);
  SQTable::NewSlot(pSVar1,&local_d8,&local_e8);
  ::SQObjectPtr::~SQObjectPtr(&local_e8);
  ::SQObjectPtr::~SQObjectPtr(&local_d8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"continue",-1);
  ::SQObjectPtr::SQObjectPtr(&local_f8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_108,0x123);
  SQTable::NewSlot(pSVar1,&local_f8,&local_108);
  ::SQObjectPtr::~SQObjectPtr(&local_108);
  ::SQObjectPtr::~SQObjectPtr(&local_f8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"return",-1);
  ::SQObjectPtr::SQObjectPtr(&local_118,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_128,0x11e);
  SQTable::NewSlot(pSVar1,&local_118,&local_128);
  ::SQObjectPtr::~SQObjectPtr(&local_128);
  ::SQObjectPtr::~SQObjectPtr(&local_118);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"null",-1);
  ::SQObjectPtr::SQObjectPtr(&local_138,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_148,0x116);
  SQTable::NewSlot(pSVar1,&local_138,&local_148);
  ::SQObjectPtr::~SQObjectPtr(&local_148);
  ::SQObjectPtr::~SQObjectPtr(&local_138);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"function",-1);
  ::SQObjectPtr::SQObjectPtr(&local_158,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_168,0x11d);
  SQTable::NewSlot(pSVar1,&local_158,&local_168);
  ::SQObjectPtr::~SQObjectPtr(&local_168);
  ::SQObjectPtr::~SQObjectPtr(&local_158);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"local",-1);
  ::SQObjectPtr::SQObjectPtr(&local_178,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_188,0x11b);
  SQTable::NewSlot(pSVar1,&local_178,&local_188);
  ::SQObjectPtr::~SQObjectPtr(&local_188);
  ::SQObjectPtr::~SQObjectPtr(&local_178);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"for",-1);
  ::SQObjectPtr::SQObjectPtr(&local_198,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_1a8,0x114);
  SQTable::NewSlot(pSVar1,&local_198,&local_1a8);
  ::SQObjectPtr::~SQObjectPtr(&local_1a8);
  ::SQObjectPtr::~SQObjectPtr(&local_198);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"foreach",-1);
  ::SQObjectPtr::SQObjectPtr(&local_1b8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_1c8,0x117);
  SQTable::NewSlot(pSVar1,&local_1b8,&local_1c8);
  ::SQObjectPtr::~SQObjectPtr(&local_1c8);
  ::SQObjectPtr::~SQObjectPtr(&local_1b8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"in",-1);
  ::SQObjectPtr::SQObjectPtr(&local_1d8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_1e8,0x118);
  SQTable::NewSlot(pSVar1,&local_1d8,&local_1e8);
  ::SQObjectPtr::~SQObjectPtr(&local_1e8);
  ::SQObjectPtr::~SQObjectPtr(&local_1d8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"typeof",-1);
  ::SQObjectPtr::SQObjectPtr(&local_1f8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_208,0x11f);
  SQTable::NewSlot(pSVar1,&local_1f8,&local_208);
  ::SQObjectPtr::~SQObjectPtr(&local_208);
  ::SQObjectPtr::~SQObjectPtr(&local_1f8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"base",-1);
  ::SQObjectPtr::SQObjectPtr(&local_218,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_228,0x106);
  SQTable::NewSlot(pSVar1,&local_218,&local_228);
  ::SQObjectPtr::~SQObjectPtr(&local_228);
  ::SQObjectPtr::~SQObjectPtr(&local_218);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"delete",-1);
  ::SQObjectPtr::SQObjectPtr(&local_238,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_248,0x107);
  SQTable::NewSlot(pSVar1,&local_238,&local_248);
  ::SQObjectPtr::~SQObjectPtr(&local_248);
  ::SQObjectPtr::~SQObjectPtr(&local_238);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"try",-1);
  ::SQObjectPtr::SQObjectPtr(&local_258,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_268,0x125);
  SQTable::NewSlot(pSVar1,&local_258,&local_268);
  ::SQObjectPtr::~SQObjectPtr(&local_268);
  ::SQObjectPtr::~SQObjectPtr(&local_258);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"catch",-1);
  ::SQObjectPtr::SQObjectPtr(&local_278,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_288,0x126);
  SQTable::NewSlot(pSVar1,&local_278,&local_288);
  ::SQObjectPtr::~SQObjectPtr(&local_288);
  ::SQObjectPtr::~SQObjectPtr(&local_278);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"throw",-1);
  ::SQObjectPtr::SQObjectPtr(&local_298,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_2a8,0x127);
  SQTable::NewSlot(pSVar1,&local_298,&local_2a8);
  ::SQObjectPtr::~SQObjectPtr(&local_2a8);
  ::SQObjectPtr::~SQObjectPtr(&local_298);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"clone",-1);
  ::SQObjectPtr::SQObjectPtr(&local_2b8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_2c8,0x11c);
  SQTable::NewSlot(pSVar1,&local_2b8,&local_2c8);
  ::SQObjectPtr::~SQObjectPtr(&local_2c8);
  ::SQObjectPtr::~SQObjectPtr(&local_2b8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"yield",-1);
  ::SQObjectPtr::SQObjectPtr(&local_2d8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_2e8,0x124);
  SQTable::NewSlot(pSVar1,&local_2d8,&local_2e8);
  ::SQObjectPtr::~SQObjectPtr(&local_2e8);
  ::SQObjectPtr::~SQObjectPtr(&local_2d8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"resume",-1);
  ::SQObjectPtr::SQObjectPtr(&local_2f8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_308,0x12a);
  SQTable::NewSlot(pSVar1,&local_2f8,&local_308);
  ::SQObjectPtr::~SQObjectPtr(&local_308);
  ::SQObjectPtr::~SQObjectPtr(&local_2f8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"switch",-1);
  ::SQObjectPtr::SQObjectPtr(&local_318,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_328,0x10c);
  SQTable::NewSlot(pSVar1,&local_318,&local_328);
  ::SQObjectPtr::~SQObjectPtr(&local_328);
  ::SQObjectPtr::~SQObjectPtr(&local_318);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"case",-1);
  ::SQObjectPtr::SQObjectPtr(&local_338,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_348,300);
  SQTable::NewSlot(pSVar1,&local_338,&local_348);
  ::SQObjectPtr::~SQObjectPtr(&local_348);
  ::SQObjectPtr::~SQObjectPtr(&local_338);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"default",-1);
  ::SQObjectPtr::SQObjectPtr(&local_358,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_368,0x12d);
  SQTable::NewSlot(pSVar1,&local_358,&local_368);
  ::SQObjectPtr::~SQObjectPtr(&local_368);
  ::SQObjectPtr::~SQObjectPtr(&local_358);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"this",-1);
  ::SQObjectPtr::SQObjectPtr(&local_378,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_388,0x12e);
  SQTable::NewSlot(pSVar1,&local_378,&local_388);
  ::SQObjectPtr::~SQObjectPtr(&local_388);
  ::SQObjectPtr::~SQObjectPtr(&local_378);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"class",-1);
  ::SQObjectPtr::SQObjectPtr(&local_398,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_3a8,0x133);
  SQTable::NewSlot(pSVar1,&local_398,&local_3a8);
  ::SQObjectPtr::~SQObjectPtr(&local_3a8);
  ::SQObjectPtr::~SQObjectPtr(&local_398);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"extends",-1);
  ::SQObjectPtr::SQObjectPtr(&local_3b8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_3c8,0x134);
  SQTable::NewSlot(pSVar1,&local_3b8,&local_3c8);
  ::SQObjectPtr::~SQObjectPtr(&local_3c8);
  ::SQObjectPtr::~SQObjectPtr(&local_3b8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"constructor",-1);
  ::SQObjectPtr::SQObjectPtr(&local_3d8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_3e8,0x136);
  SQTable::NewSlot(pSVar1,&local_3d8,&local_3e8);
  ::SQObjectPtr::~SQObjectPtr(&local_3e8);
  ::SQObjectPtr::~SQObjectPtr(&local_3d8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"instanceof",-1);
  ::SQObjectPtr::SQObjectPtr(&local_3f8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_408,0x137);
  SQTable::NewSlot(pSVar1,&local_3f8,&local_408);
  ::SQObjectPtr::~SQObjectPtr(&local_408);
  ::SQObjectPtr::~SQObjectPtr(&local_3f8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"true",-1);
  ::SQObjectPtr::SQObjectPtr(&local_418,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_428,0x13b);
  SQTable::NewSlot(pSVar1,&local_418,&local_428);
  ::SQObjectPtr::~SQObjectPtr(&local_428);
  ::SQObjectPtr::~SQObjectPtr(&local_418);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"false",-1);
  ::SQObjectPtr::SQObjectPtr(&local_438,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_448,0x13c);
  SQTable::NewSlot(pSVar1,&local_438,&local_448);
  ::SQObjectPtr::~SQObjectPtr(&local_448);
  ::SQObjectPtr::~SQObjectPtr(&local_438);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"static",-1);
  ::SQObjectPtr::SQObjectPtr(&local_458,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_468,0x142);
  SQTable::NewSlot(pSVar1,&local_458,&local_468);
  ::SQObjectPtr::~SQObjectPtr(&local_468);
  ::SQObjectPtr::~SQObjectPtr(&local_458);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"enum",-1);
  ::SQObjectPtr::SQObjectPtr(&local_478,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_488,0x143);
  SQTable::NewSlot(pSVar1,&local_478,&local_488);
  ::SQObjectPtr::~SQObjectPtr(&local_488);
  ::SQObjectPtr::~SQObjectPtr(&local_478);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"const",-1);
  ::SQObjectPtr::SQObjectPtr(&local_498,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_4a8,0x144);
  SQTable::NewSlot(pSVar1,&local_498,&local_4a8);
  ::SQObjectPtr::~SQObjectPtr(&local_4a8);
  ::SQObjectPtr::~SQObjectPtr(&local_498);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"__LINE__",-1);
  ::SQObjectPtr::SQObjectPtr(&local_4b8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_4c8,0x139);
  SQTable::NewSlot(pSVar1,&local_4b8,&local_4c8);
  ::SQObjectPtr::~SQObjectPtr(&local_4c8);
  ::SQObjectPtr::~SQObjectPtr(&local_4b8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"__FILE__",-1);
  ::SQObjectPtr::SQObjectPtr(&local_4d8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_4e8,0x13a);
  SQTable::NewSlot(pSVar1,&local_4d8,&local_4e8);
  ::SQObjectPtr::~SQObjectPtr(&local_4e8);
  ::SQObjectPtr::~SQObjectPtr(&local_4d8);
  pSVar1 = this->_keywords;
  pSVar2 = SQString::Create((SQSharedState *)rg_local,"rawcall",-1);
  ::SQObjectPtr::SQObjectPtr(&local_4f8,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_508,0x145);
  SQTable::NewSlot(pSVar1,&local_4f8,&local_508);
  ::SQObjectPtr::~SQObjectPtr(&local_508);
  ::SQObjectPtr::~SQObjectPtr(&local_4f8);
  this->_readf = (SQLEXREADFUNC)up_local;
  this->_up = efunc_local;
  this->_currentline = 1;
  this->_lasttokenline = 1;
  this->_currentcolumn = 0;
  this->_prevtoken = -1;
  this->_reached_eof = 0;
  Next(this);
  return;
}

Assistant:

void SQLexer::Init(SQSharedState *ss, SQLEXREADFUNC rg, SQUserPointer up,CompilerErrorFunc efunc,void *ed)
{
    _errfunc = efunc;
    _errtarget = ed;
    _sharedstate = ss;
    _keywords = SQTable::Create(ss, 37);
    ADD_KEYWORD(while, TK_WHILE);
    ADD_KEYWORD(do, TK_DO);
    ADD_KEYWORD(if, TK_IF);
    ADD_KEYWORD(else, TK_ELSE);
    ADD_KEYWORD(break, TK_BREAK);
    ADD_KEYWORD(continue, TK_CONTINUE);
    ADD_KEYWORD(return, TK_RETURN);
    ADD_KEYWORD(null, TK_NULL);
    ADD_KEYWORD(function, TK_FUNCTION);
    ADD_KEYWORD(local, TK_LOCAL);
    ADD_KEYWORD(for, TK_FOR);
    ADD_KEYWORD(foreach, TK_FOREACH);
    ADD_KEYWORD(in, TK_IN);
    ADD_KEYWORD(typeof, TK_TYPEOF);
    ADD_KEYWORD(base, TK_BASE);
    ADD_KEYWORD(delete, TK_DELETE);
    ADD_KEYWORD(try, TK_TRY);
    ADD_KEYWORD(catch, TK_CATCH);
    ADD_KEYWORD(throw, TK_THROW);
    ADD_KEYWORD(clone, TK_CLONE);
    ADD_KEYWORD(yield, TK_YIELD);
    ADD_KEYWORD(resume, TK_RESUME);
    ADD_KEYWORD(switch, TK_SWITCH);
    ADD_KEYWORD(case, TK_CASE);
    ADD_KEYWORD(default, TK_DEFAULT);
    ADD_KEYWORD(this, TK_THIS);
    ADD_KEYWORD(class,TK_CLASS);
    ADD_KEYWORD(extends,TK_EXTENDS);
    ADD_KEYWORD(constructor,TK_CONSTRUCTOR);
    ADD_KEYWORD(instanceof,TK_INSTANCEOF);
    ADD_KEYWORD(true,TK_TRUE);
    ADD_KEYWORD(false,TK_FALSE);
    ADD_KEYWORD(static,TK_STATIC);
    ADD_KEYWORD(enum,TK_ENUM);
    ADD_KEYWORD(const,TK_CONST);
    ADD_KEYWORD(__LINE__,TK___LINE__);
    ADD_KEYWORD(__FILE__,TK___FILE__);
    ADD_KEYWORD(rawcall, TK_RAWCALL);


    _readf = rg;
    _up = up;
    _lasttokenline = _currentline = 1;
    _currentcolumn = 0;
    _prevtoken = -1;
    _reached_eof = SQFalse;
    Next();
}